

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder*>,long_long>
               (reverse_iterator<QHolder_*> first,longlong n,reverse_iterator<QHolder_*> d_first)

{
  QHolder *pQVar1;
  Data *pDVar2;
  undefined8 uVar3;
  char16_t *pcVar4;
  int *piVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  QHolder *pQVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  QHolder *pQVar11;
  QHolder *pQVar12;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (QHolder *)((d_first.current)->holderName).d.d;
  pQVar11 = local_38.end.current + -n;
  pQVar1 = (QHolder *)((first.current)->holderName).d.d;
  pQVar12 = pQVar1;
  pQVar8 = pQVar11;
  if (pQVar11 < pQVar1) {
    pQVar12 = pQVar11;
    pQVar8 = pQVar1;
  }
  pQVar1 = (QHolder *)((d_first.current)->holderName).d.d;
  while (pQVar1 != pQVar8) {
    pDVar2 = ((first.current)->holderName).d.d;
    uVar3 = *(undefined8 *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    *(undefined8 *)&pQVar1[-1].holderName.d.d = uVar3;
    pcVar4 = (char16_t *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pQVar1[-1].holderName.d.ptr = pcVar4;
    qVar6 = *(qsizetype *)&pDVar2[-1].super_QArrayData;
    qVar7 = pDVar2[-1].super_QArrayData.alloc;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pQVar1[-1].holderName.d.size = qVar6;
    pQVar1[-1].holderPos = qVar7;
    ((d_first.current)->holderName).d.d = ((d_first.current)->holderName).d.d + -2;
    ((first.current)->holderName).d.d = ((first.current)->holderName).d.d + -2;
    pQVar1 = (QHolder *)((d_first.current)->holderName).d.d;
  }
  local_38.iter = &local_38.end;
  local_38.intermediate.current = (QHolder *)((d_first.current)->holderName).d.d;
  while (pQVar1 = (QHolder *)((d_first.current)->holderName).d.d, pQVar1 != pQVar11) {
    pDVar2 = ((first.current)->holderName).d.d;
    uVar3 = *(undefined8 *)&pQVar1[-1].holderName.d.d;
    *(undefined8 *)&pQVar1[-1].holderName.d.d = *(undefined8 *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (QBasicAtomicInt)(int)uVar3;
    pDVar2[-2].super_QArrayData.flags = (ArrayOptions)(int)((ulong)uVar3 >> 0x20);
    pcVar4 = pQVar1[-1].holderName.d.ptr;
    pQVar1[-1].holderName.d.ptr = (char16_t *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = (qsizetype)pcVar4;
    uVar9 = *(undefined4 *)&pQVar1[-1].holderName.d.size;
    uVar10 = *(undefined4 *)((long)&pQVar1[-1].holderName.d.size + 4);
    pQVar1[-1].holderName.d.size = *(qsizetype *)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (QBasicAtomicInt)uVar9;
    pDVar2[-1].super_QArrayData.flags = (ArrayOptions)uVar10;
    pQVar1[-1].holderPos = pDVar2[-1].super_QArrayData.alloc;
    ((d_first.current)->holderName).d.d = ((d_first.current)->holderName).d.d + -2;
    ((first.current)->holderName).d.d = ((first.current)->holderName).d.d + -2;
  }
  while (pQVar1 = (QHolder *)((first.current)->holderName).d.d, pQVar1 != pQVar12) {
    ((first.current)->holderName).d.d = (Data *)(pQVar1 + 1);
    piVar5 = *(int **)&(pQVar1->holderName).d.d;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pQVar1->holderName).d.d,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder_*>,_long_long>::Destructor::
  ~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}